

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void handle_accept(cio_server_socket *server_socket,void *handler_context,cio_error err,
                  cio_socket *socket)

{
  cio_connect_handler_t *pp_Var1;
  _Bool *buffered_stream;
  int *handler_context_00;
  cio_read_buffer **timer;
  cio_eventloop **timer_00;
  cio_socket_close_hook_t p_Var2;
  cio_error cVar3;
  cio_io_stream *stream;
  
  stream = cio_socket_get_io_stream(socket);
  if ((err == CIO_SUCCESS) && (stream != (cio_io_stream *)0x0)) {
    socket[-1].impl.close_timer.impl.loop = (cio_eventloop *)0x0;
    socket[2].impl.ev.read_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
    socket[2].impl.ev.write_callback = (_func_void_void_ptr_cio_epoll_error *)0x1;
    *(code **)&socket[-2].impl.close_timer.impl.ev.fd = mark_to_be_closed;
    socket[-2].impl.loop = (cio_eventloop *)add_response_header;
    socket[-2].impl.close_timer.impl.loop = (cio_eventloop *)write_response;
    socket[2].impl.close_timer.impl.ev.write_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
    *(undefined4 *)&socket[2].impl.ev.context = 0;
    socket[1].stream.write_some =
         (_func_cio_error_cio_io_stream_ptr_cio_write_buffer_ptr_cio_io_stream_write_handler_t_void_ptr
          *)(socket + 1);
    socket[1].stream.read_some =
         (_func_cio_error_cio_io_stream_ptr_cio_read_buffer_ptr_cio_io_stream_read_handler_t_void_ptr
          *)(socket + 1);
    socket[1].stream.close = (_func_cio_error_cio_io_stream_ptr *)0x0;
    socket[1].stream.read_handler = (cio_io_stream_read_handler_t)0x0;
    *(undefined8 *)&socket[-1].impl.peer_closed_connection = 0;
    http_parser_settings_init((http_parser_settings *)&socket[2].impl.peer_closed_connection);
    socket[3].stream.read_some = on_url;
    socket[2].impl.loop = (cio_eventloop *)handler_context;
    http_parser_init((http_parser *)&socket[2].impl.close_timer.impl.ev.context,HTTP_REQUEST);
    p_Var2 = socket[3].close_hook;
    if (p_Var2 == (cio_socket_close_hook_t)0x0) {
      handle_accept_cold_3();
    }
    else {
      pp_Var1 = &socket[3].handler;
      socket[-1].impl.close_timer.handler_context = pp_Var1;
      socket[-1].impl.close_timer.impl.ev.read_callback =
           (_func_void_void_ptr_cio_epoll_error *)(p_Var2 + (long)socket + 0x2d8);
      socket[-1].impl.close_timer.impl.ev.context = pp_Var1;
      socket[-1].impl.close_timer.impl.ev.write_callback =
           (_func_void_void_ptr_cio_epoll_error *)pp_Var1;
      buffered_stream = &socket[-2].impl.peer_closed_connection;
      cVar3 = cio_buffered_stream_init((cio_buffered_stream *)buffered_stream,stream);
      if (cVar3 == CIO_SUCCESS) {
        handler_context_00 = &socket[-2].impl.close_timer.impl.ev.fd;
        timer = &socket[2].stream.read_buffer;
        cVar3 = cio_timer_init((cio_timer *)timer,*(cio_eventloop **)((long)handler_context + 0x78),
                               (cio_timer_close_hook_t)0x0);
        if (cVar3 == CIO_SUCCESS) {
          timer_00 = &socket[1].impl.close_timer.impl.loop;
          cVar3 = cio_timer_init((cio_timer *)timer_00,
                                 *(cio_eventloop **)((long)handler_context + 0x78),
                                 (cio_timer_close_hook_t)0x0);
          if (cVar3 == CIO_SUCCESS) {
            cVar3 = cio_timer_expires_from_now
                              ((cio_timer *)timer_00,*(uint64_t *)((long)handler_context + 0x90),
                               client_timeout_handler,handler_context_00);
            if (cVar3 == CIO_SUCCESS) {
              *(code **)&socket[2].impl.ev.fd = finish_request_line;
              cVar3 = cio_buffered_stream_read_until
                                ((cio_buffered_stream *)buffered_stream,
                                 (cio_read_buffer *)&socket[-1].impl.close_timer.handler_context,
                                 "\r\n",parse,handler_context_00);
              if (cVar3 == CIO_SUCCESS) {
                return;
              }
            }
            cio_timer_close((cio_timer *)timer_00);
          }
          cio_timer_close((cio_timer *)timer);
        }
        handle_accept_cold_2();
      }
      else {
        handle_accept_cold_1();
      }
    }
  }
  else {
    handle_accept_cold_4();
  }
  return;
}

Assistant:

static void handle_accept(struct cio_server_socket *server_socket, void *handler_context, enum cio_error err, struct cio_socket *socket)
{
	(void)server_socket;

	struct cio_http_server *server = (struct cio_http_server *)handler_context;
	struct cio_io_stream *stream = cio_socket_get_io_stream(socket);

	if (cio_unlikely((err != CIO_SUCCESS) || (stream == NULL))) {
		handle_error(server, "accept failed");
		if (stream == NULL) {
			server->free_client(socket);
		} else {
			stream->close(stream);
		}

		return;
	}

	struct cio_http_client *client = cio_container_of(socket, struct cio_http_client, socket);

	client->http_private.headers_complete = false;
	client->content_length = 0;
	client->http_private.to_be_closed = false;
	client->http_private.remaining_content_length = 0;
	client->http_private.should_keepalive = true;
	client->http_private.close_immediately = false;
	client->http_private.parsing = 0;
	client->http_private.response_fired = false;
	client->close = mark_to_be_closed;
	client->add_response_header = add_response_header;
	client->write_response = write_response;
	client->response_written_cb = NULL;
	client->http_private.response_written = false;
	client->http_private.response_written_completed = false;
	client->http_private.request_complete = false;

	cio_write_buffer_head_init(&client->response_wbh);

	client->current_handler = NULL;
	http_parser_settings_init(&client->parser_settings);
	client->parser_settings.on_url = on_url;
	client->parser.data = server;
	http_parser_init(&client->parser, HTTP_REQUEST);

	err = cio_read_buffer_init(&client->rb, client->buffer, client->buffer_size);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(server, "read buffer init failed");
		stream->close(stream);
		return;
	}

	err = cio_buffered_stream_init(&client->buffered_stream, stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(server, "buffered_stream init failed");
		stream->close(stream);
		return;
	}

	err = cio_timer_init(&client->http_private.response_timer, server->loop, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto response_timer_init_err;
	}

	err = cio_timer_init(&client->http_private.request_timer, server->loop, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto request_timer_init_err;
	}

	err = cio_timer_expires_from_now(&client->http_private.request_timer, server->read_header_timeout_ns, client_timeout_handler, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_timer;
	}

	client->http_private.finish_func = finish_request_line;
	err = cio_buffered_stream_read_until(&client->buffered_stream, &client->rb, CIO_CRLF, parse, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto close_timer;
	}

	return;

close_timer:
	cio_timer_close(&client->http_private.request_timer);
request_timer_init_err:
	cio_timer_close(&client->http_private.response_timer);
response_timer_init_err:
	handle_error(server, "client initialization failed");
	notify_free_handler_and_close_stream(client);
}